

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_svm.cc
# Opt level: O0

bool update(svm_params *params,size_t pos)

{
  ulong *puVar1;
  svm_example *this;
  float *pfVar2;
  v_array<float> v2;
  svm_example **ppsVar3;
  flat_example *pfVar4;
  float **ppfVar5;
  float *pfVar6;
  size_t in_RSI;
  char *in_RDI;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  double dVar11;
  double dVar12;
  label_data *ldi;
  size_t i;
  float diff;
  float ai;
  float proj;
  float alpha_old;
  float alphaKi;
  float *inprods;
  label_data *ld;
  svm_example *fec;
  bool overshoot;
  svm_model *model;
  size_t in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  svm_example *in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  ulong i_00;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  
  puVar1 = *(ulong **)(in_RDI + 0x38);
  ppsVar3 = v_array<svm_example_*>::operator[]((v_array<svm_example_*> *)(puVar1 + 1),in_RSI);
  this = *ppsVar3;
  pfVar4 = &this->ex;
  svm_example::compute_kernels
            (in_stack_ffffffffffffff80,
             (svm_params *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  ppfVar5 = v_array<float>::begin(&this->krow);
  pfVar2 = *ppfVar5;
  v2._end = (float *)in_stack_ffffffffffffff88;
  v2._begin = (float *)in_stack_ffffffffffffff80;
  v2.end_array._0_4_ = in_stack_ffffffffffffff90;
  v2.end_array._4_4_ = in_stack_ffffffffffffff94;
  v2.erase_count._0_4_ = in_stack_ffffffffffffff98;
  v2.erase_count._4_4_ = in_stack_ffffffffffffff9c;
  fVar7 = dense_dot((float *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),v2,
                    in_stack_ffffffffffffff68);
  fVar8 = (fVar7 * (pfVar4->l).simple.label) / *(float *)(in_RDI + 0x50) - 1.0;
  pfVar6 = v_array<float>::operator[]((v_array<float> *)(puVar1 + 9),in_RSI);
  *pfVar6 = fVar8;
  pfVar6 = v_array<float>::operator[]((v_array<float> *)(puVar1 + 5),in_RSI);
  fVar8 = *pfVar6;
  pfVar6 = v_array<float>::operator[]((v_array<float> *)(puVar1 + 5),in_RSI);
  fVar9 = *pfVar6;
  fVar10 = pfVar2[in_RSI];
  pfVar6 = v_array<float>::operator[]((v_array<float> *)(puVar1 + 5),in_RSI);
  *pfVar6 = 0.0;
  fVar9 = (*(float *)(in_RDI + 0x50) - (-fVar9 * fVar10 + fVar7) * (pfVar4->l).simple.label) /
          pfVar2[in_RSI];
  pfVar6 = &(this->ex).l.simple.weight;
  if (fVar9 < *pfVar6 || fVar9 == *pfVar6) {
    if (fVar9 < 0.0) {
      fVar9 = 0.0;
    }
  }
  else {
    fVar9 = (this->ex).l.simple.weight;
  }
  fVar9 = (pfVar4->l).simple.label * fVar9;
  fVar10 = fVar9 - fVar8;
  dVar11 = std::fabs((double)(ulong)(uint)fVar10);
  dVar12 = std::fabs((double)(ulong)(uint)fVar10);
  if (1.0 < SUB84(dVar12,0)) {
    fVar10 = (float)(-(uint)(0.0 < fVar10) & 0x3f800000) - (float)(fVar10 < 0.0);
    fVar9 = fVar8 + fVar10;
  }
  for (i_00 = 0; i_00 < *puVar1; i_00 = i_00 + 1) {
    ppsVar3 = v_array<svm_example_*>::operator[]((v_array<svm_example_*> *)(puVar1 + 1),i_00);
    fVar8 = (fVar10 * pfVar2[i_00] * ((*ppsVar3)->ex).l.simple.label) / *(float *)(in_RDI + 0x50);
    pfVar6 = v_array<float>::operator[]((v_array<float> *)(puVar1 + 9),i_00);
    *pfVar6 = fVar8 + *pfVar6;
  }
  dVar12 = std::fabs((double)(ulong)(uint)fVar9);
  if (1e-10 < SUB84(dVar12,0)) {
    pfVar6 = v_array<float>::operator[]((v_array<float> *)(puVar1 + 5),in_RSI);
    *pfVar6 = fVar9;
  }
  else {
    remove(in_RDI);
  }
  return 1e-06 < SUB84(dVar11,0);
}

Assistant:

bool update(svm_params& params, size_t pos)
{
  // params.all->opts_n_args.trace_message<<"Update\n";
  svm_model* model = params.model;
  bool overshoot = false;
  // params.all->opts_n_args.trace_message<<"Updating model "<<pos<<" "<<model->num_support<<" ";
  svm_example* fec = model->support_vec[pos];
  label_data& ld = fec->ex.l.simple;
  fec->compute_kernels(params);
  float* inprods = fec->krow.begin();
  float alphaKi = dense_dot(inprods, model->alpha, model->num_support);
  model->delta[pos] = alphaKi * ld.label / params.lambda - 1;
  float alpha_old = model->alpha[pos];
  alphaKi -= model->alpha[pos] * inprods[pos];
  model->alpha[pos] = 0.;

  float proj = alphaKi * ld.label;
  float ai = (params.lambda - proj) / inprods[pos];
  // cout<<model->num_support<<" "<<pos<<" "<<proj<<" "<<alphaKi<<" "<<alpha_old<<" "<<ld.label<<"
  // "<<model->delta[pos]<<" " << ai<<" "<<params.lambda<<endl;

  if (ai > fec->ex.l.simple.weight)
    ai = fec->ex.l.simple.weight;
  else if (ai < 0)
    ai = 0;

  ai *= ld.label;
  float diff = ai - alpha_old;

  if (fabs(diff) > 1.0e-06)
    overshoot = true;

  if (fabs(diff) > 1.)
  {
    // params.all->opts_n_args.trace_message<<"Here\n";
    diff = (float)(diff > 0) - (diff < 0);
    ai = alpha_old + diff;
  }

  for (size_t i = 0; i < model->num_support; i++)
  {
    label_data& ldi = model->support_vec[i]->ex.l.simple;
    model->delta[i] += diff * inprods[i] * ldi.label / params.lambda;
  }

  if (fabs(ai) <= 1.0e-10)
    remove(params, pos);
  else
    model->alpha[pos] = ai;

  return overshoot;
}